

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool pugi::impl::anon_unknown_0::get_mutable_buffer
               (char_t **out_buffer,size_t *out_length,void *contents,size_t size,bool is_mutable)

{
  char_t *__dest;
  undefined3 in_register_00000081;
  
  if (CONCAT31(in_register_00000081,is_mutable) == 0) {
    __dest = (char_t *)
             (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                       (size + 1);
    if (__dest == (char_t *)0x0) {
      return false;
    }
    if (contents == (void *)0x0) {
      if (size != 0) {
        __assert_fail("length == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x809,
                      "bool pugi::impl::(anonymous namespace)::get_mutable_buffer(char_t *&, size_t &, const void *, size_t, bool)"
                     );
      }
    }
    else {
      memcpy(__dest,contents,size);
    }
    __dest[size] = '\0';
    size = size + 1;
    contents = __dest;
  }
  *out_buffer = (char_t *)contents;
  *out_length = size;
  return true;
}

Assistant:

PUGI__FN bool get_mutable_buffer(char_t*& out_buffer, size_t& out_length, const void* contents, size_t size, bool is_mutable)
	{
		size_t length = size / sizeof(char_t);

		if (is_mutable)
		{
			out_buffer = static_cast<char_t*>(const_cast<void*>(contents));
			out_length = length;
		}
		else
		{
			char_t* buffer = static_cast<char_t*>(xml_memory::allocate((length + 1) * sizeof(char_t)));
			if (!buffer) return false;

			if (contents)
				memcpy(buffer, contents, length * sizeof(char_t));
			else
				assert(length == 0);

			buffer[length] = 0;

			out_buffer = buffer;
			out_length = length + 1;
		}

		return true;
	}